

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

void __thiscall
ncnn::Yolov3DetectionOutput::nms_sorted_bboxes
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *bboxes,vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer puVar5;
  iterator __position;
  pointer pBVar6;
  unsigned_long uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  unsigned_long local_30;
  float local_24;
  
  puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_30 = 0;
  lVar8 = (long)(bboxes->
                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(bboxes->
                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    local_24 = nms_threshold;
    do {
      puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      uVar9 = (uint)((ulong)((long)__position._M_current - (long)puVar5) >> 3);
      if (0 < (int)uVar9) {
        pBVar6 = (bboxes->
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = pBVar6[local_30].xmin;
        uVar10 = 0;
        do {
          uVar7 = puVar5[uVar10];
          fVar12 = pBVar6[uVar7].xmax;
          fVar11 = 0.0;
          if (fVar1 <= fVar12) {
            fVar2 = pBVar6[local_30].xmax;
            fVar14 = pBVar6[uVar7].xmin;
            if (fVar14 <= fVar2) {
              fVar3 = pBVar6[local_30].ymin;
              fVar13 = pBVar6[uVar7].ymax;
              if (fVar3 <= fVar13) {
                fVar4 = pBVar6[local_30].ymax;
                fVar15 = pBVar6[uVar7].ymin;
                if (fVar15 <= fVar4) {
                  if (fVar2 <= fVar12) {
                    fVar12 = fVar2;
                  }
                  if (fVar14 <= fVar1) {
                    fVar14 = fVar1;
                  }
                  if (fVar4 <= fVar13) {
                    fVar13 = fVar4;
                  }
                  if (fVar15 <= fVar3) {
                    fVar15 = fVar3;
                  }
                  fVar11 = (fVar13 - fVar15) * (fVar12 - fVar14);
                }
              }
            }
          }
          if (((pBVar6[local_30].area - fVar11) + pBVar6[uVar7].area) * nms_threshold < fVar11)
          goto LAB_0044a742;
          uVar10 = uVar10 + 1;
        } while ((uVar9 & 0x7fffffff) != uVar10);
      }
      if (__position._M_current ==
          (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)picked,__position,
                   &local_30);
        nms_threshold = local_24;
      }
      else {
        *__position._M_current = local_30;
        (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_0044a742:
      local_30 = local_30 + 1;
    } while (local_30 < (ulong)((lVar8 >> 2) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void Yolov3DetectionOutput::nms_sorted_bboxes(std::vector<BBoxRect>& bboxes, std::vector<size_t>& picked, float nms_threshold) const
{
    picked.clear();

    const size_t n = bboxes.size();

    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = a.area + b.area - inter_area;
            // float IoU = inter_area / union_area
            if (inter_area > nms_threshold * union_area)
            {
                keep = 0;
                break;
            }
        }

        if (keep)
            picked.push_back(i);
    }
}